

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha2-512.c
# Opt level: O2

void pp_crypto_hash_sha2_512_process(PHashSHA2_512 *ctx,puint64 *data)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  puint64 *ppVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long alStack_338 [6];
  ulong local_308 [8];
  ulong auStack_2c8 [2];
  puint64 local_2b8;
  ulong auStack_2b0 [15];
  puint64 apStack_238 [65];
  
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    local_308[lVar1] = ctx->hash[lVar1];
  }
  lVar4 = 0x10;
  ppVar8 = &local_2b8;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *ppVar8 = *data;
    data = data + 1;
    ppVar8 = ppVar8 + 1;
  }
  for (; lVar4 != 0x50; lVar4 = lVar4 + 1) {
    uVar10 = auStack_2c8[lVar4];
    uVar2 = local_308[lVar4 + -5];
    (&local_2b8)[lVar4] =
         (uVar10 >> 6 ^ (uVar10 << 3 | uVar10 >> 0x3d) ^ (uVar10 << 0x2d | uVar10 >> 0x13)) +
         local_308[lVar4 + 3] + alStack_338[lVar4] +
         (uVar2 >> 7 ^
         (uVar2 << 0x38 | uVar2 >> 8) ^ (uVar2 >> 1 | (ulong)((uVar2 & 1) != 0) << 0x3f));
  }
  for (uVar10 = 0; uVar10 < 0x50; uVar10 = uVar10 + 8) {
    lVar1 = ((local_308[4] << 0x17 | local_308[4] >> 0x29) ^
            (local_308[4] << 0x2e | local_308[4] >> 0x12) ^
            (local_308[4] << 0x32 | local_308[4] >> 0xe)) + local_308[7] +
            pp_crypto_hash_sha2_512_K[uVar10] + (&local_2b8)[uVar10] +
            ((local_308[5] ^ local_308[6]) & local_308[4] ^ local_308[6]);
    uVar3 = local_308[3] + lVar1;
    lVar4 = ((local_308[5] ^ local_308[4]) & uVar3 ^ local_308[5]) + local_308[6] +
            pp_crypto_hash_sha2_512_K[uVar10 + 1] +
            ((uVar3 * 0x800000 | uVar3 >> 0x29) ^
            (uVar3 << 0x2e | uVar3 >> 0x12) ^ (uVar3 << 0x32 | uVar3 >> 0xe)) + auStack_2b0[uVar10];
    uVar11 = ((local_308[1] | local_308[0]) & local_308[2] | local_308[1] & local_308[0]) +
             ((local_308[0] << 0x19 | local_308[0] >> 0x27) ^
             (local_308[0] << 0x1e | local_308[0] >> 0x22) ^
             (local_308[0] << 0x24 | local_308[0] >> 0x1c)) + lVar1;
    uVar5 = local_308[2] + lVar4;
    uVar2 = ((uVar11 | local_308[0]) & local_308[1] | uVar11 & local_308[0]) +
            ((uVar11 * 0x2000000 | uVar11 >> 0x27) ^
            (uVar11 * 0x40000000 | uVar11 >> 0x22) ^ (uVar11 << 0x24 | uVar11 >> 0x1c)) + lVar4;
    lVar1 = local_308[5] + pp_crypto_hash_sha2_512_K[uVar10 + 2] + auStack_2b0[uVar10 + 1] +
            ((uVar3 ^ local_308[4]) & uVar5 ^ local_308[4]) +
            ((uVar5 * 0x800000 | uVar5 >> 0x29) ^
            (uVar5 << 0x2e | uVar5 >> 0x12) ^ (uVar5 << 0x32 | uVar5 >> 0xe));
    uVar7 = local_308[1] + lVar1;
    uVar6 = ((uVar2 | uVar11) & local_308[0] | uVar2 & uVar11) +
            ((uVar2 * 0x2000000 | uVar2 >> 0x27) ^
            (uVar2 * 0x40000000 | uVar2 >> 0x22) ^ (uVar2 << 0x24 | uVar2 >> 0x1c)) + lVar1;
    lVar1 = local_308[4] + pp_crypto_hash_sha2_512_K[uVar10 + 3] + auStack_2b0[uVar10 + 2] +
            ((uVar5 ^ uVar3) & uVar7 ^ uVar3) +
            ((uVar7 * 0x800000 | uVar7 >> 0x29) ^
            (uVar7 << 0x2e | uVar7 >> 0x12) ^ (uVar7 << 0x32 | uVar7 >> 0xe));
    uVar9 = local_308[0] + lVar1;
    uVar12 = ((uVar6 | uVar2) & uVar11 | uVar6 & uVar2) +
             ((uVar6 * 0x2000000 | uVar6 >> 0x27) ^
             (uVar6 * 0x40000000 | uVar6 >> 0x22) ^ (uVar6 << 0x24 | uVar6 >> 0x1c)) + lVar1;
    lVar1 = uVar3 + pp_crypto_hash_sha2_512_K[uVar10 + 4] + auStack_2b0[uVar10 + 3] +
            ((uVar7 ^ uVar5) & uVar9 ^ uVar5) +
            ((uVar9 * 0x800000 | uVar9 >> 0x29) ^
            (uVar9 << 0x2e | uVar9 >> 0x12) ^ (uVar9 << 0x32 | uVar9 >> 0xe));
    local_308[7] = uVar11 + lVar1;
    local_308[3] = lVar1 + ((uVar12 | uVar6) & uVar2 | uVar12 & uVar6) +
                           ((uVar12 * 0x2000000 | uVar12 >> 0x27) ^
                           (uVar12 * 0x40000000 | uVar12 >> 0x22) ^
                           (uVar12 << 0x24 | uVar12 >> 0x1c));
    lVar1 = uVar5 + pp_crypto_hash_sha2_512_K[uVar10 + 5] + auStack_2b0[uVar10 + 4] +
            ((uVar9 ^ uVar7) & local_308[7] ^ uVar7) +
            ((local_308[7] * 0x800000 | local_308[7] >> 0x29) ^
            (local_308[7] << 0x2e | local_308[7] >> 0x12) ^
            (local_308[7] << 0x32 | local_308[7] >> 0xe));
    local_308[6] = uVar2 + lVar1;
    local_308[2] = lVar1 + ((local_308[3] | uVar12) & uVar6 | local_308[3] & uVar12) +
                           ((local_308[3] * 0x2000000 | local_308[3] >> 0x27) ^
                           (local_308[3] * 0x40000000 | local_308[3] >> 0x22) ^
                           (local_308[3] << 0x24 | local_308[3] >> 0x1c));
    lVar1 = uVar7 + pp_crypto_hash_sha2_512_K[uVar10 + 6] + auStack_2b0[uVar10 + 5] +
            ((local_308[7] ^ uVar9) & local_308[6] ^ uVar9) +
            ((local_308[6] * 0x800000 | local_308[6] >> 0x29) ^
            (local_308[6] << 0x2e | local_308[6] >> 0x12) ^
            (local_308[6] << 0x32 | local_308[6] >> 0xe));
    local_308[5] = uVar6 + lVar1;
    local_308[1] = lVar1 + ((local_308[2] | local_308[3]) & uVar12 | local_308[2] & local_308[3]) +
                           ((local_308[2] * 0x2000000 | local_308[2] >> 0x27) ^
                           (local_308[2] * 0x40000000 | local_308[2] >> 0x22) ^
                           (local_308[2] << 0x24 | local_308[2] >> 0x1c));
    lVar1 = uVar9 + pp_crypto_hash_sha2_512_K[uVar10 + 7] + auStack_2b0[uVar10 + 6] +
            ((local_308[6] ^ local_308[7]) & local_308[5] ^ local_308[7]) +
            ((local_308[5] * 0x800000 | local_308[5] >> 0x29) ^
            (local_308[5] << 0x2e | local_308[5] >> 0x12) ^
            (local_308[5] << 0x32 | local_308[5] >> 0xe));
    local_308[4] = uVar12 + lVar1;
    local_308[0] = lVar1 + ((local_308[1] | local_308[2]) & local_308[3] |
                           local_308[1] & local_308[2]) +
                           ((local_308[1] * 0x2000000 | local_308[1] >> 0x27) ^
                           (local_308[1] * 0x40000000 | local_308[1] >> 0x22) ^
                           (local_308[1] << 0x24 | local_308[1] >> 0x1c));
  }
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    ctx->hash[lVar1] = ctx->hash[lVar1] + local_308[lVar1];
  }
  return;
}

Assistant:

static void
pp_crypto_hash_sha2_512_process (PHashSHA2_512	*ctx,
				 const puint64	data[16])
{
	puint64	tmp_sum1;
	puint64	tmp_sum2;
	puint64 W[80];
	puint64	A[8];
	puint	i;

	for (i = 0; i < 8; ++i)
		A[i] = ctx->hash[i];

	memcpy (W, data, 128);

	for (i = 16; i < 80; ++i)
		W[i] = P_SHA2_512_S1 (W[i -  2]) + W[i -  7] + P_SHA2_512_S0 (W[i - 15]) + W[i - 16];

	for (i = 0; i < 80; i += 8) {
		P_SHA2_512_P (A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], W[i + 0], pp_crypto_hash_sha2_512_K[i + 0])
		P_SHA2_512_P (A[7], A[0], A[1], A[2], A[3], A[4], A[5], A[6], W[i + 1], pp_crypto_hash_sha2_512_K[i + 1])
		P_SHA2_512_P (A[6], A[7], A[0], A[1], A[2], A[3], A[4], A[5], W[i + 2], pp_crypto_hash_sha2_512_K[i + 2])
		P_SHA2_512_P (A[5], A[6], A[7], A[0], A[1], A[2], A[3], A[4], W[i + 3], pp_crypto_hash_sha2_512_K[i + 3])
		P_SHA2_512_P (A[4], A[5], A[6], A[7], A[0], A[1], A[2], A[3], W[i + 4], pp_crypto_hash_sha2_512_K[i + 4])
		P_SHA2_512_P (A[3], A[4], A[5], A[6], A[7], A[0], A[1], A[2], W[i + 5], pp_crypto_hash_sha2_512_K[i + 5])
		P_SHA2_512_P (A[2], A[3], A[4], A[5], A[6], A[7], A[0], A[1], W[i + 6], pp_crypto_hash_sha2_512_K[i + 6])
		P_SHA2_512_P (A[1], A[2], A[3], A[4], A[5], A[6], A[7], A[0], W[i + 7], pp_crypto_hash_sha2_512_K[i + 7])
	}

	for (i = 0; i < 8; ++i)
		ctx->hash[i] += A[i];
}